

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O2

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_rc4_40>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
::finalize<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_rc4_40>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
           *this,back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 first)

{
  int iVar1;
  long lVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> bVar3;
  int written;
  uint8_t buffer [64];
  int local_5c;
  uchar local_58 [72];
  
  iVar1 = EVP_EncryptFinal_ex(*(EVP_CIPHER_CTX **)this,local_58,&local_5c);
  if (iVar1 == 1) {
    lVar2 = (long)local_5c;
  }
  else {
    local_5c = 0;
    lVar2 = 0;
  }
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + lVar2;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_58,local_58 + lVar2,first);
  return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         bVar3.container;
}

Assistant:

Output finalize(Output first) {
			std::uint8_t buffer[2*EVP_MAX_BLOCK_LENGTH];

			int written;
			if (FinalFx(_context, buffer, &written) != 1)
				written = 0;

			_total_output += written;

			return std::copy(buffer, buffer + written, first);
		}